

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.cpp
# Opt level: O1

int showgetposition_setposition_Pololu
              (int *showgetposition,int *setposition,BOOL *bConnected,int threadperiod,
              POLOLU *pololu,int deviceid)

{
  int iVar1;
  uint channel;
  char *__s;
  int ivalue;
  uint local_44;
  timespec local_40;
  
  local_44 = 0;
  if ((uint)*showgetposition < 0x18) {
    iVar1 = GetValuePololu(pololu,*showgetposition,(int *)&local_44);
    if (iVar1 != 0) goto LAB_00158b50;
    local_40.tv_sec = 0;
    local_40.tv_nsec = 10000000;
    nanosleep(&local_40,(timespec *)0x0);
    printf("%d\n",(ulong)local_44);
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    ShowGetPositionMaestroPololu[deviceid] = -1;
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    *showgetposition = -1;
  }
  channel = *setposition % 100;
  if (0x17 < channel) {
    return 0;
  }
  iVar1 = SetPWMPololu(pololu,channel,*setposition / 100);
  if (iVar1 == 0) {
    local_40.tv_sec = 0;
    local_40.tv_nsec = 10000000;
    nanosleep(&local_40,(timespec *)0x0);
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    SetPositionMaestroPololu[deviceid] = -1;
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    *setposition = -1;
    return 0;
  }
LAB_00158b50:
  puts("Connection to a Pololu lost.");
  *bConnected = 0;
  iVar1 = CloseRS232Port(&pololu->RS232Port);
  __s = "Pololu disconnection failed.";
  if (iVar1 == 0) {
    __s = "Pololu disconnected.";
  }
  puts(__s);
  local_40.tv_sec = (long)threadperiod / 1000;
  local_40.tv_nsec = ((long)threadperiod % 1000) * 1000000;
  nanosleep(&local_40,(timespec *)0x0);
  return 1;
}

Assistant:

int showgetposition_setposition_Pololu(int& showgetposition, int& setposition, BOOL& bConnected, int threadperiod, POLOLU& pololu, int deviceid)
{
	int ivalue = 0;

	if ((showgetposition >= 0)&&(showgetposition < NB_CHANNELS_PWM_POLOLU))
	{
		if (GetValuePololu(&pololu, showgetposition, &ivalue) != EXIT_SUCCESS)
		{
			printf("Connection to a Pololu lost.\n");
			bConnected = FALSE;
			DisconnectPololu(&pololu);
			mSleep(threadperiod);
			return EXIT_FAILURE;
		}
		mSleep(10);
		printf("%d\n", ivalue);
		EnterCriticalSection(&StateVariablesCS);
		ShowGetPositionMaestroPololu[deviceid] = -1;
		LeaveCriticalSection(&StateVariablesCS);
		showgetposition = -1;
	}
	if (((setposition%100) >= 0)&&((setposition%100) < NB_CHANNELS_PWM_POLOLU))
	{
		if (SetPWMPololu(&pololu, (setposition%100), (setposition/100)) != EXIT_SUCCESS)
		{
			printf("Connection to a Pololu lost.\n");
			bConnected = FALSE;
			DisconnectPololu(&pololu);
			mSleep(threadperiod);
			return EXIT_FAILURE;
		}
		mSleep(10);
		EnterCriticalSection(&StateVariablesCS);
		SetPositionMaestroPololu[deviceid] = -1;
		LeaveCriticalSection(&StateVariablesCS);
		setposition = -1;
	}

	return EXIT_SUCCESS;
}